

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

from_chars_result __thiscall
semver::detail::version_parser::parse_prerelease_identifier(version_parser *this,string *out)

{
  token_stream *ptVar1;
  size_t sVar2;
  pointer ptVar3;
  char __c;
  ulong uVar4;
  variant_alternative_t<2UL,_variant<monostate,_unsigned_char,_char,_range_operator>_> *pvVar5;
  variant_alternative_t<1UL,_variant<monostate,_unsigned_char,_char,_range_operator>_> *pvVar6;
  token_type tVar7;
  uint uVar8;
  int iVar9;
  undefined8 uVar10;
  pointer ptVar11;
  int iVar12;
  char *pcVar13;
  from_chars_result fVar14;
  token token;
  string result;
  undefined8 local_60;
  char *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  ptVar1 = this->stream;
  sVar2 = ptVar1->current;
  ptVar3 = (ptVar1->tokens).
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start;
  ptVar11 = ptVar3 + sVar2;
  uVar4._0_1_ = ptVar11->type;
  uVar4._1_2_ = ptVar11->value;
  uVar4._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
  local_58 = ptVar3[sVar2].lexeme;
  ptVar1->current = sVar2 + 1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  do {
    local_60 = uVar4;
    if ((char)uVar4 == '\x06') {
      pvVar6 = std::get<1UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           *)((long)&local_60 + 1));
      if (*pvVar6 == '\0') {
        sVar2 = this->stream->current;
        ptVar11 = (this->stream->tokens).
                  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        tVar7 = ptVar11[sVar2].type;
        if ((byte)(tVar7 - hyphen) < 3) {
          ptVar11 = ptVar11 + sVar2;
          iVar9 = 0;
          iVar12 = 0;
          do {
            ptVar11 = ptVar11 + 1;
            iVar12 = iVar12 + 1;
            iVar9 = iVar9 + (uint)(tVar7 == digit);
            tVar7 = ptVar11->type;
          } while ((byte)(tVar7 - hyphen) < 3);
          if (iVar12 == iVar9 && iVar9 != 0) {
            uVar10 = 0x16;
            pcVar13 = local_58;
            goto LAB_0015eba6;
          }
        }
      }
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::push_back(&local_50,*pvVar6 + '0');
    }
    else {
      uVar8 = (uint)uVar4 & 0xff;
      if (uVar8 == 5) {
        pvVar5 = std::get<2UL,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                           ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                             *)((long)&local_60 + 1));
        __c = *pvVar5;
      }
      else {
        __c = '-';
        if (uVar8 != 4) {
          uVar10 = 0x16;
          pcVar13 = local_58;
          goto LAB_0015eba6;
        }
      }
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::push_back(&local_50,__c);
    }
    ptVar1 = this->stream;
    sVar2 = ptVar1->current;
    ptVar3 = (ptVar1->tokens).
             super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ptVar11 = ptVar3 + sVar2;
    uVar4._0_1_ = ptVar11->type;
    uVar4._1_2_ = ptVar11->value;
    uVar4._3_5_ = *(undefined5 *)&ptVar11->field_0x3;
    if (2 < (uVar4 & 0xff) - 4) {
      Catch::clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
      ::_M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)out,&local_50
                 );
      uVar10 = 0;
      pcVar13 = (this->stream->tokens).
                super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
                _M_impl.super__Vector_impl_data._M_start[this->stream->current].lexeme;
LAB_0015eba6:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      fVar14.super_from_chars_result._8_8_ = uVar10;
      fVar14.super_from_chars_result.ptr = pcVar13;
      return (from_chars_result)fVar14.super_from_chars_result;
    }
    local_58 = ptVar3[sVar2].lexeme;
    ptVar1->current = sVar2 + 1;
  } while( true );
}

Assistant:

parse_prerelease_identifier(std::string& out) {
    std::string result;
    token token = stream.advance();

    do {
      switch (token.type) {
      case token_type::hyphen:
        result.push_back('-');
        break;
      case token_type::letter:
        result.push_back(std::get<char>(token.value));
        break;
      case token_type::digit:
      {
        const auto digit = std::get<std::uint8_t>(token.value);

        // numerical prerelease identifier doesn't allow leading zero 
        // 1.2.3-1.alpha is valid,
        // 1.2.3-01b is valid as well, but
        // 1.2.3-01.alpha is not valid

        if (is_leading_zero(digit)) {
          return failure(token.lexeme);
        }

        result.push_back(to_char(digit));
        break;
      }
      default:
        return failure(token.lexeme);
      }
    } while (stream.advanceIfMatch(token, token_type::hyphen) || stream.advanceIfMatch(token, token_type::letter) || stream.advanceIfMatch(token, token_type::digit));

    out = result;
    return success(stream.peek().lexeme);
  }